

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseBoundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,BindingHash *bindings,
          Index binding_index_offset)

{
  iterator __position;
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  Type type;
  string name;
  Location loc;
  Type local_c8;
  Index local_c4;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  *local_c0;
  string local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Token local_78;
  
  local_c4 = binding_index_offset;
  local_c0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)bindings;
  do {
    bVar1 = MatchLpar(this,token);
    if (!bVar1) {
      return (Result)Ok;
    }
    TVar2 = Peek(this,0);
    if (TVar2 == Last_String) {
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      GetToken(&local_78,this);
      local_98 = CONCAT44(local_78.loc.filename.data_._4_4_,local_78.loc.filename.data_._0_4_);
      uStack_90 = CONCAT44(local_78.loc.filename.size_._4_4_,(undefined4)local_78.loc.filename.size_
                          );
      local_88 = CONCAT44(local_78.loc.field_1.field_0.first_column,
                          local_78.loc.field_1.field_0.line);
      uStack_80 = CONCAT44(local_78.loc.field_1._12_4_,local_78.loc.field_1.field_0.last_column);
      ParseBindVarOpt(this,&local_b8);
      RVar3 = ParseValueType(this,&local_c8);
      if (RVar3.enum_ != Error) {
        local_78.token_type_ =
             (int)((ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) + local_c4;
        local_78.loc.field_1.field_0.line = (int)local_88;
        local_78.loc.field_1.field_0.first_column = local_88._4_4_;
        local_78.loc.field_1.field_0.last_column = (int)uStack_80;
        local_78.loc.field_1._12_4_ = uStack_80._4_4_;
        local_78.loc.filename.data_._0_4_ = (undefined4)local_98;
        local_78.loc.filename.data_._4_4_ = local_98._4_4_;
        local_78.loc.filename.size_._0_4_ = (undefined4)uStack_90;
        local_78.loc.filename.size_._4_4_ = uStack_90._4_4_;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
        ::_M_emplace<std::__cxx11::string&,wabt::Binding>(local_c0,0,&local_b8,&local_78);
        __position._M_current =
             (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
                    ((vector<wabt::Type,std::allocator<wabt::Type>> *)types,__position,&local_c8);
        }
        else {
          (__position._M_current)->enum_ = local_c8.enum_;
          (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
    }
    else {
      RVar3 = ParseValueTypeList(this,types);
    }
  } while ((RVar3.enum_ != Error) && (RVar3 = Expect(this,Rpar), RVar3.enum_ != Error));
  return (Result)Error;
}

Assistant:

Result WastParser::ParseBoundValueTypeList(TokenType token,
                                           TypeVector* types,
                                           BindingHash* bindings,
                                           Index binding_index_offset) {
  WABT_TRACE(ParseBoundValueTypeList);
  while (MatchLpar(token)) {
    if (PeekMatch(TokenType::Var)) {
      std::string name;
      Type type;
      Location loc = GetLocation();
      ParseBindVarOpt(&name);
      CHECK_RESULT(ParseValueType(&type));
      bindings->emplace(name,
                        Binding(loc, binding_index_offset + types->size()));
      types->push_back(type);
    } else {
      CHECK_RESULT(ParseValueTypeList(types));
    }
    EXPECT(Rpar);
  }
  return Result::Ok;
}